

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  int protocol;
  char *in_RCX;
  ulong uVar5;
  int family;
  int sock;
  int family_00;
  int sock_00;
  int sock_01;
  int family_01;
  int sock_02;
  int family_02;
  int family_03;
  int sock_03;
  int sock_04;
  int family_04;
  int family_05;
  int sock_05;
  int sock_06;
  int family_06;
  int sock_07;
  int family_07;
  int family_08;
  int sock_08;
  int sock_09;
  int sock_10;
  int sock_11;
  int sock_12;
  int family_09;
  int sock_13;
  int sock_14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  undefined8 extraout_RDX_02;
  char *pcVar7;
  int iVar8;
  FILE *__stream;
  void *in_R9;
  bool bVar9;
  undefined8 uStackY_c0;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  size_t sz;
  char any_address [128];
  
  uVar1 = get_test_port(argc,argv);
  test_addr_from(socket_address,"127.0.0.1",(char *)(ulong)uVar1,(int)in_RCX);
  uVar1 = get_test_port(argc,argv);
  iVar8 = 0x10310a;
  test_addr_from(any_address,"*",(char *)(ulong)uVar1,(int)in_RCX);
  iVar2 = test_socket_impl((char *)0x5e,iVar8,family,(int)in_RCX);
  test_bind_impl((char *)0x5f,iVar2,(int)any_address,in_RCX);
  test_close_impl((char *)0x60,iVar2,sock);
  iVar8 = 100;
  iVar2 = test_socket_impl((char *)0x64,iVar2,family_00,(int)in_RCX);
  test_connect_impl((char *)0x65,iVar2,sock_00,in_RCX);
  iVar3 = (int)in_RCX;
  test_close_impl((char *)0x66,iVar2,sock_01);
  iVar2 = test_socket_impl((char *)0x69,iVar2,family_01,iVar3);
  pcVar7 = &stack0xffffffffffffff4c;
  iVar3 = nn_getsockopt(iVar2,0xfffffffffffffffc,1);
  if (iVar3 == 0) {
    if (in_stack_ffffffffffffff4c == 2) {
      iVar3 = nn_connect(iVar2,"ws://127.0.0.1");
      if (iVar3 < 0) {
        nn_backtrace_print();
        __stream = _stderr;
        puVar4 = (uint *)__errno_location();
        pcVar7 = nn_err_strerror(*puVar4);
        uVar5 = (ulong)*puVar4;
        uStackY_c0 = 0x74;
        goto LAB_001020e9;
      }
      iVar3 = nn_connect(iVar2,"ws://*:");
      if (iVar3 < 0) {
        iVar3 = nn_errno();
        if (iVar3 != 0x16) {
          nn_backtrace_print();
          __stream = _stderr;
          puVar4 = (uint *)__errno_location();
          pcVar7 = nn_err_strerror(*puVar4);
          uVar5 = (ulong)*puVar4;
          uStackY_c0 = 0x79;
          goto LAB_001020e9;
        }
        iVar3 = nn_connect(iVar2,"ws://*:1000000");
        if (iVar3 < 0) {
          iVar3 = nn_errno();
          if (iVar3 != 0x16) {
            nn_backtrace_print();
            __stream = _stderr;
            puVar4 = (uint *)__errno_location();
            pcVar7 = nn_err_strerror(*puVar4);
            uVar5 = (ulong)*puVar4;
            uStackY_c0 = 0x7c;
            goto LAB_001020e9;
          }
          iVar3 = nn_connect(iVar2,"ws://*:some_port");
          if (iVar3 < 0) {
            iVar3 = nn_connect(iVar2,"ws://eth10000;127.0.0.1:5555");
            if (iVar3 < 0) {
              iVar3 = nn_errno();
              if (iVar3 != 0x13) {
                nn_backtrace_print();
                __stream = _stderr;
                puVar4 = (uint *)__errno_location();
                pcVar7 = nn_err_strerror(*puVar4);
                uVar5 = (ulong)*puVar4;
                uStackY_c0 = 0x81;
                goto LAB_001020e9;
              }
              iVar3 = nn_bind(iVar2,"ws://127.0.0.1:");
              if (iVar3 < 0) {
                iVar3 = nn_errno();
                if (iVar3 != 0x16) {
                  nn_backtrace_print();
                  __stream = _stderr;
                  puVar4 = (uint *)__errno_location();
                  pcVar7 = nn_err_strerror(*puVar4);
                  uVar5 = (ulong)*puVar4;
                  uStackY_c0 = 0x85;
                  goto LAB_001020e9;
                }
                iVar3 = nn_bind(iVar2,"ws://127.0.0.1:1000000");
                if (iVar3 < 0) {
                  iVar3 = nn_errno();
                  if (iVar3 != 0x16) {
                    nn_backtrace_print();
                    __stream = _stderr;
                    puVar4 = (uint *)__errno_location();
                    pcVar7 = nn_err_strerror(*puVar4);
                    uVar5 = (ulong)*puVar4;
                    uStackY_c0 = 0x88;
                    goto LAB_001020e9;
                  }
                  iVar3 = nn_bind(iVar2,"ws://eth10000:5555");
                  if (iVar3 < 0) {
                    iVar3 = nn_errno();
                    if (iVar3 != 0x13) {
                      nn_backtrace_print();
                      __stream = _stderr;
                      puVar4 = (uint *)__errno_location();
                      pcVar7 = nn_err_strerror(*puVar4);
                      uVar5 = (ulong)*puVar4;
                      uStackY_c0 = 0x8b;
                      goto LAB_001020e9;
                    }
                    iVar3 = nn_connect(iVar2,"ws://:5555");
                    if (iVar3 < 0) {
                      iVar3 = nn_errno();
                      if (iVar3 != 0x16) {
                        nn_backtrace_print();
                        __stream = _stderr;
                        puVar4 = (uint *)__errno_location();
                        pcVar7 = nn_err_strerror(*puVar4);
                        uVar5 = (ulong)*puVar4;
                        uStackY_c0 = 0x8f;
                        goto LAB_001020e9;
                      }
                      iVar3 = nn_connect(iVar2,"ws://-hostname:5555");
                      if (iVar3 < 0) {
                        iVar3 = nn_errno();
                        if (iVar3 != 0x16) {
                          nn_backtrace_print();
                          __stream = _stderr;
                          puVar4 = (uint *)__errno_location();
                          pcVar7 = nn_err_strerror(*puVar4);
                          uVar5 = (ulong)*puVar4;
                          uStackY_c0 = 0x92;
                          goto LAB_001020e9;
                        }
                        iVar3 = nn_connect(iVar2,"ws://abc.123.---.#:5555");
                        if (iVar3 < 0) {
                          iVar3 = nn_errno();
                          if (iVar3 != 0x16) {
                            nn_backtrace_print();
                            __stream = _stderr;
                            puVar4 = (uint *)__errno_location();
                            pcVar7 = nn_err_strerror(*puVar4);
                            uVar5 = (ulong)*puVar4;
                            uStackY_c0 = 0x95;
                            goto LAB_001020e9;
                          }
                          iVar3 = nn_connect(iVar2,"ws://[::1]:5555");
                          if (iVar3 < 0) {
                            iVar3 = nn_errno();
                            if (iVar3 != 0x16) {
                              nn_backtrace_print();
                              __stream = _stderr;
                              puVar4 = (uint *)__errno_location();
                              pcVar7 = nn_err_strerror(*puVar4);
                              uVar5 = (ulong)*puVar4;
                              uStackY_c0 = 0x98;
                              goto LAB_001020e9;
                            }
                            iVar3 = nn_connect(iVar2,"ws://abc...123:5555");
                            if (iVar3 < 0) {
                              iVar3 = nn_errno();
                              if (iVar3 != 0x16) {
                                nn_backtrace_print();
                                __stream = _stderr;
                                puVar4 = (uint *)__errno_location();
                                pcVar7 = nn_err_strerror(*puVar4);
                                uVar5 = (ulong)*puVar4;
                                uStackY_c0 = 0x9b;
                                goto LAB_001020e9;
                              }
                              iVar3 = nn_connect(iVar2,"ws://.123:5555");
                              if (iVar3 < 0) {
                                iVar3 = nn_errno();
                                if (iVar3 != 0x16) {
                                  nn_backtrace_print();
                                  __stream = _stderr;
                                  puVar4 = (uint *)__errno_location();
                                  pcVar7 = nn_err_strerror(*puVar4);
                                  uVar5 = (ulong)*puVar4;
                                  uStackY_c0 = 0x9e;
                                  goto LAB_001020e9;
                                }
                                test_close_impl((char *)0xa0,iVar2,sock_02);
                                iVar3 = test_socket_impl((char *)0xa2,iVar2,family_02,(int)pcVar7);
                                iVar2 = iVar3;
                                test_bind_impl((char *)0xa3,iVar3,0x105100,pcVar7);
                                iVar2 = test_socket_impl((char *)0xa4,iVar2,family_03,(int)pcVar7);
                                test_connect_impl((char *)0xa5,iVar2,sock_03,pcVar7);
                                uVar6 = extraout_RDX;
                                while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
                                  test_send_impl((char *)0xaa,iVar2,0x103259,pcVar7);
                                  test_recv_impl((char *)0xab,iVar3,0x103259,pcVar7);
                                  test_send_impl((char *)0xad,iVar3,0x10325d,pcVar7);
                                  test_recv_impl((char *)0xae,iVar2,0x10325d,pcVar7);
                                  uVar6 = extraout_RDX_00;
                                }
                                iVar8 = 100;
                                while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
                                  test_send_impl((char *)0xb3,iVar2,0x103261,pcVar7);
                                  uVar6 = extraout_RDX_01;
                                }
                                iVar8 = 100;
                                while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
                                  test_recv_impl((char *)0xb6,iVar3,0x103261,pcVar7);
                                  uVar6 = extraout_RDX_02;
                                }
                                test_close_impl((char *)0xb9,iVar2,(int)uVar6);
                                test_close_impl((char *)0xba,iVar3,sock_04);
                                iVar2 = test_socket_impl((char *)0xbd,iVar3,family_04,(int)pcVar7);
                                iVar8 = iVar2;
                                test_bind_impl((char *)0xbe,iVar2,0x105100,pcVar7);
                                protocol = (int)pcVar7;
                                iVar8 = test_socket_impl((char *)0xbf,iVar8,family_05,protocol);
                                iVar3 = nn_bind(iVar8,socket_address);
                                if (iVar3 < 0) {
                                  iVar3 = nn_errno();
                                  if (iVar3 != 0x62) {
                                    nn_backtrace_print();
                                    __stream = _stderr;
                                    puVar4 = (uint *)__errno_location();
                                    pcVar7 = nn_err_strerror(*puVar4);
                                    uVar5 = (ulong)*puVar4;
                                    uStackY_c0 = 0xc3;
                                    goto LAB_001020e9;
                                  }
                                  test_close_impl((char *)0xc4,iVar2,sock_05);
                                  test_close_impl((char *)0xc5,iVar8,sock_06);
                                  iVar8 = test_socket_impl((char *)0xc8,iVar8,family_06,protocol);
                                  iVar2 = nn_setsockopt(iVar8,0,0x10,&stack0xffffffffffffff4c,4);
                                  if (iVar2 < 0) {
                                    nn_backtrace_print();
                                    pcVar7 = "rc >= 0";
                                    uStackY_c0 = 0xcb;
                                  }
                                  else {
                                    pcVar7 = &stack0xffffffffffffff4c;
                                    iVar2 = nn_setsockopt(iVar8,0,0x10,pcVar7,4);
                                    if (iVar2 < 0) {
                                      iVar2 = nn_errno();
                                      if (iVar2 != 0x16) {
                                        nn_backtrace_print();
                                        __stream = _stderr;
                                        puVar4 = (uint *)__errno_location();
                                        pcVar7 = nn_err_strerror(*puVar4);
                                        uVar5 = (ulong)*puVar4;
                                        uStackY_c0 = 0xcf;
                                        goto LAB_001020e9;
                                      }
                                      test_close_impl((char *)0xd0,iVar8,sock_07);
                                      iVar2 = test_socket_impl((char *)0xd3,iVar8,family_07,
                                                               (int)pcVar7);
                                      iVar8 = iVar2;
                                      test_bind_impl((char *)0xd4,iVar2,0x105100,pcVar7);
                                      iVar8 = test_socket_impl((char *)0xd5,iVar8,family_08,
                                                               (int)pcVar7);
                                      test_connect_impl((char *)0xd6,iVar8,sock_08,pcVar7);
                                      iVar3 = 1000;
                                      test_setsockopt_impl
                                                ((char *)0xd8,iVar8,0,4,
                                                 (int)&stack0xffffffffffffff4c,in_R9,
                                                 CONCAT44(1000,in_stack_ffffffffffffff48));
                                      if (iVar3 == 1000) {
                                        test_setsockopt_impl
                                                  ((char *)0xdb,iVar2,0,5,
                                                   (int)&stack0xffffffffffffff4c,in_R9,
                                                   CONCAT44(1000,in_stack_ffffffffffffff48));
                                        if (iVar3 == 1000) {
                                          pcVar7 = (char *)0x10;
                                          test_setsockopt_impl
                                                    ((char *)0xde,iVar2,0,0x10,
                                                     (int)&stack0xffffffffffffff4c,in_R9,
                                                     CONCAT44(4,in_stack_ffffffffffffff48));
                                          test_send_impl((char *)0xdf,iVar8,0x103259,pcVar7);
                                          test_recv_impl((char *)0xe0,iVar2,0x103259,pcVar7);
                                          test_send_impl((char *)0xe1,iVar8,0x10329e,pcVar7);
                                          test_recv_impl((char *)0xe2,iVar2,0x10329e,pcVar7);
                                          test_send_impl((char *)0xe3,iVar8,0x1032a3,pcVar7);
                                          test_drop_impl((char *)0xe4,iVar2,sock_09,(int)pcVar7);
                                          pcVar7 = (char *)0x10;
                                          test_setsockopt_impl
                                                    ((char *)0xea,iVar2,0,0x10,
                                                     (int)&stack0xffffffffffffff4c,in_R9,
                                                     CONCAT44(5,in_stack_ffffffffffffff48));
                                          test_connect_impl((char *)0xeb,iVar8,sock_10,pcVar7);
                                          test_send_impl((char *)0xec,iVar8,0x1032a3,pcVar7);
                                          test_recv_impl((char *)0xed,iVar2,0x1032a3,pcVar7);
                                          test_close_impl((char *)0xee,iVar2,sock_11);
                                          test_close_impl((char *)0xef,iVar8,sock_12);
                                          test_text();
                                          iVar8 = test_socket_impl((char *)0xf4,iVar8,family_09,
                                                                   (int)pcVar7);
                                          test_connect_impl((char *)0xf5,iVar8,sock_13,pcVar7);
                                          nn_sleep(100);
                                          test_close_impl((char *)0xf7,iVar8,sock_14);
                                          return 0;
                                        }
                                        nn_backtrace_print();
                                        pcVar7 = "opt == 1000";
                                        uStackY_c0 = 0xdc;
                                      }
                                      else {
                                        nn_backtrace_print();
                                        pcVar7 = "opt == 1000";
                                        uStackY_c0 = 0xd9;
                                      }
                                    }
                                    else {
                                      nn_backtrace_print();
                                      pcVar7 = "rc < 0";
                                      uStackY_c0 = 0xce;
                                    }
                                  }
                                }
                                else {
                                  nn_backtrace_print();
                                  pcVar7 = "rc < 0";
                                  uStackY_c0 = 0xc2;
                                }
                              }
                              else {
                                nn_backtrace_print();
                                pcVar7 = "rc < 0";
                                uStackY_c0 = 0x9d;
                              }
                            }
                            else {
                              nn_backtrace_print();
                              pcVar7 = "rc < 0";
                              uStackY_c0 = 0x9a;
                            }
                          }
                          else {
                            nn_backtrace_print();
                            pcVar7 = "rc < 0";
                            uStackY_c0 = 0x97;
                          }
                        }
                        else {
                          nn_backtrace_print();
                          pcVar7 = "rc < 0";
                          uStackY_c0 = 0x94;
                        }
                      }
                      else {
                        nn_backtrace_print();
                        pcVar7 = "rc < 0";
                        uStackY_c0 = 0x91;
                      }
                    }
                    else {
                      nn_backtrace_print();
                      pcVar7 = "rc < 0";
                      uStackY_c0 = 0x8e;
                    }
                  }
                  else {
                    nn_backtrace_print();
                    pcVar7 = "rc < 0";
                    uStackY_c0 = 0x8a;
                  }
                }
                else {
                  nn_backtrace_print();
                  pcVar7 = "rc < 0";
                  uStackY_c0 = 0x87;
                }
              }
              else {
                nn_backtrace_print();
                pcVar7 = "rc < 0";
                uStackY_c0 = 0x84;
              }
            }
            else {
              nn_backtrace_print();
              pcVar7 = "rc < 0";
              uStackY_c0 = 0x80;
            }
          }
          else {
            nn_backtrace_print();
            pcVar7 = "rc < 0";
            uStackY_c0 = 0x7e;
          }
        }
        else {
          nn_backtrace_print();
          pcVar7 = "rc < 0";
          uStackY_c0 = 0x7b;
        }
      }
      else {
        nn_backtrace_print();
        pcVar7 = "rc < 0";
        uStackY_c0 = 0x78;
      }
    }
    else {
      nn_backtrace_print();
      pcVar7 = "opt == NN_WS_MSG_TYPE_BINARY";
      uStackY_c0 = 0x70;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
            uStackY_c0);
  }
  else {
    nn_backtrace_print();
    __stream = _stderr;
    puVar4 = (uint *)__errno_location();
    pcVar7 = nn_err_strerror(*puVar4);
    uVar5 = (ulong)*puVar4;
    uStackY_c0 = 0x6e;
LAB_001020e9:
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar7,uVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ws.c",
            uStackY_c0);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    int sb2;
    int opt;
    size_t sz;
    int i;
    char any_address[128];

    test_addr_from (socket_address, "ws", "127.0.0.1",
            get_test_port (argc, argv));

    test_addr_from (any_address, "ws", "*",
            get_test_port (argc, argv));

    /*  Try closing bound but unconnected socket. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, any_address);
    test_close (sb);

    /*  Try closing a TCP socket while it not connected. At the same time
        test specifying the local address for the connection. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Check socket options. */
    sz = sizeof (opt);
    rc = nn_getsockopt (sc, NN_WS, NN_WS_MSG_TYPE, &opt, &sz);
    errno_assert (rc == 0);
    nn_assert (sz == sizeof (opt));
    nn_assert (opt == NN_WS_MSG_TYPE_BINARY);

    /*  Default port 80 should be assumed if not explicitly declared. */
    rc = nn_connect (sc, "ws://127.0.0.1");
    errno_assert (rc >= 0);

    /*  Try using invalid address strings. */
    rc = nn_connect (sc, "ws://*:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:some_port");
    nn_assert (rc < 0);
    rc = nn_connect (sc, "ws://eth10000;127.0.0.1:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_bind (sc, "ws://127.0.0.1:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://127.0.0.1:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://eth10000:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_connect (sc, "ws://:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://-hostname:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.---.#:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://[::1]:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc...123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://.123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);

    test_close (sc);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");

        test_send (sb, "DEF");
        test_recv (sc, "DEF");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "0123456789012345678901234567890123456789");
    }

    test_close (sc);
    test_close (sb);

    /*  Test two sockets binding to the same address. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sb2 = test_socket (AF_SP, NN_PAIR);

    rc = nn_bind (sb2, socket_address);
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EADDRINUSE);
    test_close(sb);
    test_close(sb2);

    /*  Test that NN_RCVMAXSIZE can be -1, but not lower */
    sb = test_socket (AF_SP, NN_PAIR);
    opt = -1;
    rc = nn_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    nn_assert (rc >= 0);
    opt = -2;
    rc = nn_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    test_close (sb);

    /*  Test NN_RCVMAXSIZE limit */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    opt = 1000;
    test_setsockopt (sc, NN_SOL_SOCKET, NN_SNDTIMEO, &opt, sizeof (opt));
    nn_assert (opt == 1000);
    opt = 1000;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVTIMEO, &opt, sizeof (opt));
    nn_assert (opt == 1000);
    opt = 4;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    test_send (sc, "ABC");
    test_recv (sb, "ABC");
    test_send (sc, "ABCD");
    test_recv (sb, "ABCD");
    test_send (sc, "ABCDE");
    test_drop (sb, ETIMEDOUT);

    /*  Increase the size limit, reconnect, then try sending again. The reason a
        reconnect is necessary is because after a protocol violation, the
        connecting socket will not continue automatic reconnection attempts. */
    opt = 5;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVMAXSIZE, &opt, sizeof (opt));
    test_connect (sc, socket_address);
    test_send (sc, "ABCDE");
    test_recv (sb, "ABCDE");
    test_close (sb);
    test_close (sc);

    test_text ();

    /*  Test closing a socket that is waiting to connect. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    nn_sleep (100);
    test_close (sc);

    return 0;
}